

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

size_type __thiscall wabt::string_view::find_first_of(string_view *this,char *s,size_type pos)

{
  size_t sVar1;
  size_type sVar2;
  string_view s_00;
  
  sVar1 = strlen(s);
  s_00.size_ = sVar1;
  s_00.data_ = s;
  sVar2 = find_first_of(this,s_00,pos);
  return sVar2;
}

Assistant:

string_view::size_type string_view::find_first_of(const char* s,
                                                  size_type pos) const {
  return find_first_of(string_view(s), pos);
}